

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utility.cpp
# Opt level: O0

QString * uniqueItemName(QString *__return_storage_ptr__,QModelIndex *index)

{
  bool bVar1;
  byte bVar2;
  UINT8 UVar3;
  UINT8 subtype;
  TreeModel *this;
  qsizetype qVar4;
  QChar local_1fc;
  QChar local_1fa;
  QString local_1f8;
  QString local_1e0;
  QString local_1c8;
  QString local_1b0;
  QString local_198;
  undefined1 local_180 [8];
  QString subtypeString;
  QString local_160;
  QString local_148;
  QString local_130;
  byte local_115;
  QChar local_114;
  byte local_111;
  QString local_110;
  QString local_f8;
  QString local_e0;
  undefined1 local_c8 [8];
  QString fileText;
  QModelIndex fileIndex;
  QString local_90;
  QString local_78;
  byte local_5d;
  undefined1 local_50 [8];
  QString itemText;
  QString itemName;
  TreeModel *model;
  QModelIndex *index_local;
  QString *name;
  
  bVar1 = QModelIndex::isValid(index);
  if (!bVar1) {
    QString::QString(__return_storage_ptr__,"InvalidIndex");
    return __return_storage_ptr__;
  }
  this = (TreeModel *)QModelIndex::model(index);
  TreeModel::name((QString *)&itemText.d.size,this,index);
  TreeModel::text((QString *)local_50,this,index);
  local_5d = 0;
  QString::QString(__return_storage_ptr__,(QString *)&itemText.d.size);
  bVar2 = TreeModel::type(this,index);
  if (bVar2 != 0x42) {
    if (bVar2 == 0x43) {
      TreeModel::findParentOfType((QModelIndex *)&fileText.d.size,this,index,'B');
      TreeModel::text((QString *)local_c8,this,(QModelIndex *)&fileText.d.size);
      local_111 = 0;
      local_115 = 0;
      bVar1 = QString::isEmpty((QString *)local_c8);
      if (bVar1) {
        TreeModel::name(&local_e0,this,(QModelIndex *)&fileText.d.size);
      }
      else {
        TreeModel::name(&local_110,this,(QModelIndex *)&fileText.d.size);
        local_111 = 1;
        QChar::QChar(&local_114,'_');
        operator+(&local_f8,&local_110,local_114);
        local_115 = 1;
        operator+(&local_e0,&local_f8,(QString *)local_c8);
      }
      QString::operator=(__return_storage_ptr__,(QString *)&local_e0);
      QString::~QString(&local_e0);
      if ((local_115 & 1) != 0) {
        QString::~QString(&local_f8);
      }
      if ((local_111 & 1) != 0) {
        QString::~QString(&local_110);
      }
      UVar3 = TreeModel::subtype(this,index);
      if ((UVar3 == '\x02') || (UVar3 = TreeModel::subtype(this,index), UVar3 == '\x18')) {
        TreeModel::name(&local_160,this,index);
        QChar::QChar((QChar *)((long)&subtypeString.d.size + 6),'_');
        operator+(&local_148,&local_160,subtypeString.d.size._6_2_);
        operator+(&local_130,&local_148,__return_storage_ptr__);
        QString::operator=(__return_storage_ptr__,(QString *)&local_130);
        QString::~QString(&local_130);
        QString::~QString(&local_148);
        QString::~QString(&local_160);
      }
      QString::~QString((QString *)local_c8);
      goto LAB_00187158;
    }
    if (5 < bVar2 - 0x4f) goto LAB_00187158;
  }
  fileIndex.m._5_1_ = 0;
  bVar1 = QString::isEmpty((QString *)local_50);
  if (bVar1) {
    QString::QString(&local_78,(QString *)&itemText.d.size);
  }
  else {
    QChar::QChar((QChar *)((long)&fileIndex.m + 6),'_');
    operator+(&local_90,(QString *)&itemText.d.size,fileIndex.m._6_2_);
    fileIndex.m._5_1_ = 1;
    operator+(&local_78,&local_90,(QString *)local_50);
  }
  QString::operator=(__return_storage_ptr__,(QString *)&local_78);
  QString::~QString(&local_78);
  if ((fileIndex.m._5_1_ & 1) != 0) {
    QString::~QString(&local_90);
  }
LAB_00187158:
  UVar3 = TreeModel::type(this,index);
  subtype = TreeModel::subtype(this,index);
  itemSubtypeToUString((QString *)local_180,UVar3,subtype);
  UVar3 = TreeModel::type(this,index);
  itemTypeToUString(&local_1e0,UVar3);
  qVar4 = QString::length((QString *)local_180);
  if (qVar4 == 0) {
    QString::QString(&local_1f8);
  }
  else {
    QChar::QChar(&local_1fa,'_');
    operator+(&local_1f8,local_1fa,(QString *)local_180);
  }
  operator+(&local_1c8,&local_1e0,&local_1f8);
  QChar::QChar(&local_1fc,'_');
  operator+(&local_1b0,&local_1c8,local_1fc);
  operator+(&local_198,&local_1b0,__return_storage_ptr__);
  QString::operator=(__return_storage_ptr__,(QString *)&local_198);
  QString::~QString(&local_198);
  QString::~QString(&local_1b0);
  QString::~QString(&local_1c8);
  QString::~QString(&local_1f8);
  QString::~QString(&local_1e0);
  fixFileName(__return_storage_ptr__,true);
  local_5d = 1;
  QString::~QString((QString *)local_180);
  if ((local_5d & 1) == 0) {
    QString::~QString(__return_storage_ptr__);
  }
  QString::~QString((QString *)local_50);
  QString::~QString((QString *)&itemText.d.size);
  return __return_storage_ptr__;
}

Assistant:

UString uniqueItemName(const UModelIndex & index)
{
    // Sanity check
    if (!index.isValid())
        return UString("InvalidIndex");
    
    // Get model from index
    const TreeModel* model = (const TreeModel*)index.model();
    
    // Construct the name
    UString itemName = model->name(index);
    UString itemText = model->text(index);
    
    // Default name
    UString name = itemName;
    switch (model->type(index)) {
        case Types::NvarEntry:
        case Types::VssEntry:
        case Types::SysFEntry:
        case Types::EvsaEntry:
        case Types::PhoenixFlashMapEntry:
        case Types::InsydeFlashDeviceMapEntry:
        case Types::File:
            name = itemText.isEmpty() ? itemName : itemName + '_' + itemText;
            break;
        case Types::Section: {
            // Get parent file name
            UModelIndex fileIndex = model->findParentOfType(index, Types::File);
            UString fileText = model->text(fileIndex);
            name = fileText.isEmpty() ? model->name(fileIndex) : model->name(fileIndex) + '_' + fileText;
            
            // Special case of GUIDed sections
            if (model->subtype(index) == EFI_SECTION_GUID_DEFINED || model->subtype(index) == EFI_SECTION_FREEFORM_SUBTYPE_GUID) {
                name = model->name(index) +'_' + name;
            }
        } break;
    }
    
    // Populate subtypeString
    UString subtypeString = itemSubtypeToUString(model->type(index), model->subtype(index));
    
    // Create final name
    name = itemTypeToUString(model->type(index))
    + (subtypeString.length() ? ('_' + subtypeString) : UString())
    + '_' + name;
    
    fixFileName(name, true);
    
    return name;
}